

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::ShaderAtomicAndCase::verify
          (ShaderAtomicAndCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ulong uVar1;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  int in_stack_00000008;
  long in_stack_00000010;
  uint local_3a0;
  int local_39c;
  Hex<8UL> local_390;
  MessageBuilder local_388;
  uint local_208;
  int local_204;
  deUint32 outputValue;
  int localNdx_1;
  Hex<8UL> local_1f8 [3];
  MessageBuilder local_1e0;
  uint local_60;
  int local_5c;
  deUint32 inputValue;
  int localNdx;
  deUint32 expectedValue;
  deUint32 groupOutput;
  int groupOffset;
  int groupNdx;
  deUint32 compareMask;
  int numBits;
  int numWorkGroups;
  int workGroupSize;
  void *outputs_local;
  size_t sStack_28;
  int outputStride_local;
  void *inputs_local;
  int inputStride_local;
  int numValues_local;
  ShaderAtomicAndCase *this_local;
  
  outputs_local._4_4_ = (int)tbs;
  inputs_local._4_4_ = (int)ctx;
  inputs_local._0_4_ = (int)sig;
  _numWorkGroups = tbslen;
  sStack_28 = siglen;
  _inputStride_local = this;
  numBits = product<unsigned_int,3>(&(this->super_ShaderAtomicOpCase).m_workGroupSize);
  compareMask = inputs_local._4_4_ / numBits;
  if ((this->super_ShaderAtomicOpCase).m_precision == PRECISION_HIGHP) {
    local_39c = 0x20;
  }
  else {
    local_39c = 8;
    if ((this->super_ShaderAtomicOpCase).m_precision == PRECISION_MEDIUMP) {
      local_39c = 0x10;
    }
  }
  groupNdx = local_39c;
  if (((this->super_ShaderAtomicOpCase).m_type == TYPE_UINT) || (local_39c == 0x20)) {
    local_3a0 = 0xffffffff;
  }
  else {
    local_3a0 = (1 << ((byte)local_39c & 0x1f)) - 1;
  }
  groupOffset = local_3a0;
  groupOutput = 0;
  do {
    uVar1 = (ulong)groupOutput;
    if ((int)compareMask <= (int)groupOutput) {
      this_local._7_1_ = 1;
LAB_020f8217:
      return (int)CONCAT71((int7)(uVar1 >> 8),this_local._7_1_);
    }
    expectedValue = groupOutput * numBits;
    localNdx = *(uint *)(in_stack_00000010 + (int)(groupOutput * in_stack_00000008));
    inputValue = (this->super_ShaderAtomicOpCase).m_initialValue;
    for (local_5c = 0; local_5c < numBits; local_5c = local_5c + 1) {
      local_60 = *(uint *)(sStack_28 + (long)(int)((int)inputs_local * (expectedValue + local_5c)));
      inputValue = local_60 & inputValue;
    }
    if ((localNdx & local_3a0) != (inputValue & local_3a0)) {
      pTVar2 = tcu::TestContext::getLog
                         ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_1e0,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<(&local_1e0,(char (*) [17])"ERROR: at group ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)&groupOutput);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [12])0x2b883c4);
      local_1f8[0] = tcu::toHex<unsigned_int>(inputValue);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1f8);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [7])0x2c67b94);
      _outputValue = tcu::toHex<unsigned_int>(localNdx);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(Hex<8UL> *)&outputValue);
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1e0);
      this_local._7_1_ = 0;
      uVar1 = extraout_RAX;
      goto LAB_020f8217;
    }
    for (local_204 = 0; local_204 < numBits; local_204 = local_204 + 1) {
      local_208 = *(uint *)(_numWorkGroups +
                           (long)(int)(outputs_local._4_4_ * (expectedValue + local_204)));
      if ((local_3a0 & local_208 & ((this->super_ShaderAtomicOpCase).m_initialValue ^ 0xffffffff))
          != 0) {
        pTVar2 = tcu::TestContext::getLog
                           ((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_388,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar3 = tcu::MessageBuilder::operator<<(&local_388,(char (*) [17])"ERROR: at group ");
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)&groupOutput);
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [14])", invocation ");
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_204);
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [26])": found unexpected value ");
        local_390 = tcu::toHex<unsigned_int>(local_208);
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_390);
        tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_388);
        this_local._7_1_ = 0;
        uVar1 = extraout_RAX_00;
        goto LAB_020f8217;
      }
    }
    groupOutput = groupOutput + 1;
  } while( true );
}

Assistant:

bool verify (int numValues, int inputStride, const void* inputs, int outputStride, const void* outputs, int groupStride, const void* groupOutputs) const
	{
		const int		workGroupSize	= (int)product(m_workGroupSize);
		const int		numWorkGroups	= numValues/workGroupSize;
		const int		numBits			= m_precision == PRECISION_HIGHP ? 32 :
										  m_precision == PRECISION_MEDIUMP ? 16 : 8;
		const deUint32	compareMask		= (m_type == TYPE_UINT || numBits == 32) ? ~0u : (1u<<numBits)-1u;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int		groupOffset		= groupNdx*workGroupSize;
			const deUint32	groupOutput		= *(const deUint32*)((const deUint8*)groupOutputs + groupNdx*groupStride);
			deUint32		expectedValue	= m_initialValue;

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const deUint32 inputValue = *(const deUint32*)((const deUint8*)inputs + inputStride*(groupOffset+localNdx));
				expectedValue &= inputValue;
			}

			if ((groupOutput & compareMask) != (expectedValue & compareMask))
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ": expected " << tcu::toHex(expectedValue) << ", got " << tcu::toHex(groupOutput) << TestLog::EndMessage;
				return false;
			}

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
			{
				const deUint32 outputValue = *(const deUint32*)((const deUint8*)outputs + outputStride*(groupOffset+localNdx));

				if ((compareMask & (outputValue & ~m_initialValue)) != 0)
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: at group " << groupNdx << ", invocation " << localNdx
														   << ": found unexpected value " << tcu::toHex(outputValue)
									   << TestLog::EndMessage;
					return false;
				}
			}
		}

		return true;
	}